

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

void __thiscall despot::Logger::PrintStatistics(Logger *this,int num_runs)

{
  pointer pdVar1;
  pointer pdVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nCompleted ",0xb);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,num_runs);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," run(s).",8);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Average total discounted reward (stderr) = ",0x2b);
  pdVar1 = (this->discounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar2 = (this->discounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pdVar2 - (long)pdVar1 >> 3;
  dVar7 = 0.0;
  if (pdVar2 != pdVar1) {
    lVar5 = 0;
    do {
      dVar7 = dVar7 + pdVar1[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  dVar6 = 0.0;
  if (pdVar2 != pdVar1) {
    dVar6 = dVar7 / (double)lVar4;
  }
  poVar3 = std::ostream::_M_insert<double>(dVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
  dVar7 = StderrDiscountedRoundReward(this);
  poVar3 = std::ostream::_M_insert<double>(dVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Average total undiscounted reward (stderr) = ",0x2d);
  pdVar1 = (this->undiscounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar2 = (this->undiscounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pdVar2 - (long)pdVar1 >> 3;
  dVar7 = 0.0;
  if (pdVar2 != pdVar1) {
    lVar5 = 0;
    do {
      dVar7 = dVar7 + pdVar1[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  dVar6 = 0.0;
  if (pdVar2 != pdVar1) {
    dVar6 = dVar7 / (double)lVar4;
  }
  poVar3 = std::ostream::_M_insert<double>(dVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
  dVar7 = StderrUndiscountedRoundReward(this);
  poVar3 = std::ostream::_M_insert<double>(dVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void Logger::PrintStatistics(int num_runs) {
	cout << "\nCompleted " << num_runs << " run(s)." << endl;
	cout << "Average total discounted reward (stderr) = "
			<< AverageDiscountedRoundReward() << " ("
			<< StderrDiscountedRoundReward() << ")" << endl;
	cout << "Average total undiscounted reward (stderr) = "
			<< AverageUndiscountedRoundReward() << " ("
			<< StderrUndiscountedRoundReward() << ")" << endl;
}